

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O0

Transform * __thiscall sf::Transformable::getTransform(Transformable *this)

{
  double dVar1;
  Transform local_74;
  float local_34;
  float local_30;
  float ty;
  float tx;
  float sys;
  float sxs;
  float syc;
  float sxc;
  float sine;
  float cosine;
  float angle;
  Transformable *this_local;
  
  if ((this->m_transformNeedUpdate & 1U) != 0) {
    sine = (-this->m_rotation * 3.1415927) / 180.0;
    _cosine = this;
    dVar1 = std::cos((double)(ulong)(uint)sine);
    sxc = SUB84(dVar1,0);
    dVar1 = std::sin((double)(ulong)(uint)sine);
    syc = SUB84(dVar1,0);
    sxs = (this->m_scale).x * sxc;
    sys = (this->m_scale).y * sxc;
    tx = (this->m_scale).x * syc;
    ty = (this->m_scale).y * syc;
    local_30 = -(this->m_origin).x * sxs + -((this->m_origin).y * ty) + (this->m_position).x;
    local_34 = (this->m_origin).x * tx + -((this->m_origin).y * sys) + (this->m_position).y;
    Transform::Transform(&local_74,sxs,ty,local_30,-tx,sys,local_34,0.0,0.0,1.0);
    memcpy(&this->m_transform,&local_74,0x40);
    this->m_transformNeedUpdate = false;
  }
  return &this->m_transform;
}

Assistant:

const Transform& Transformable::getTransform() const
{
    // Recompute the combined transform if needed
    if (m_transformNeedUpdate)
    {
        float angle  = -m_rotation * 3.141592654f / 180.f;
        float cosine = static_cast<float>(std::cos(angle));
        float sine   = static_cast<float>(std::sin(angle));
        float sxc    = m_scale.x * cosine;
        float syc    = m_scale.y * cosine;
        float sxs    = m_scale.x * sine;
        float sys    = m_scale.y * sine;
        float tx     = -m_origin.x * sxc - m_origin.y * sys + m_position.x;
        float ty     =  m_origin.x * sxs - m_origin.y * syc + m_position.y;

        m_transform = Transform( sxc, sys, tx,
                                -sxs, syc, ty,
                                 0.f, 0.f, 1.f);
        m_transformNeedUpdate = false;
    }

    return m_transform;
}